

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::evalTexture1DProjGradOffset(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  Texture1D *pTVar3;
  int i;
  long lVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  ulong local_48;
  undefined8 uStack_40;
  float local_38 [6];
  
  fVar1 = c->in[0].m_data[0];
  fVar2 = c->in[0].m_data[3];
  fVar6 = (float)(c->textures[0].tex1D)->m_width;
  fVar7 = c->in[1].m_data[0] * fVar6;
  fVar6 = fVar6 * c->in[2].m_data[0];
  uVar5 = -(uint)(-fVar7 <= fVar7);
  fVar7 = (float)(~uVar5 & (uint)-fVar7 | (uint)fVar7 & uVar5);
  uVar5 = -(uint)(-fVar6 <= fVar6);
  fVar6 = (float)(~uVar5 & (uint)-fVar6 | (uint)fVar6 & uVar5);
  uVar5 = -(uint)(fVar6 <= fVar7);
  fVar6 = logf((float)(~uVar5 & (uint)fVar6 | uVar5 & (uint)fVar7));
  pTVar3 = c->textures[0].tex1D;
  local_48 = (ulong)(uint)(p->offset).m_data[0];
  tcu::sampleLevelArray1DOffset
            ((ConstPixelBufferAccess *)&stack0xffffffffffffffe0,(int)(pTVar3->m_view).m_levels,
             (Sampler *)(ulong)(uint)(pTVar3->m_view).m_numLevels,fVar1 / fVar2,fVar6 * 1.442695,
             (IVec2 *)c->textures);
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  lVar4 = 0;
  do {
    local_38[lVar4] = *(float *)(&stack0xffffffffffffffe0 + lVar4 * 4) * (p->scale).m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar4 = 0;
  do {
    *(float *)((long)&local_48 + lVar4 * 4) = local_38[lVar4] + (p->bias).m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  *(ulong *)(c->color).m_data = local_48;
  *(undefined8 *)((c->color).m_data + 2) = uStack_40;
  return;
}

Assistant:

static void		evalTexture1DProjGradOffset		(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture1DOffset(c, c.in[0].x()/c.in[0].w(), computeLodFromGrad1D(c), p.offset.x())*p.scale + p.bias; }